

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

size_t __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
Count(IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
      *this)

{
  bool bVar1;
  size_t sVar2;
  iterator __end0;
  iterator __begin0;
  OUT local_1d0;
  iterator local_1b0;
  iterator local_130;
  iterator local_b0;
  
  begin(&local_130,this);
  end(&local_1b0,this);
  sVar2 = 0;
  while( true ) {
    iterator::iterator(&local_b0,&local_1b0);
    bVar1 = iterator::operator!=(&local_130,&local_b0);
    GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::~GroupByState
              (&local_b0.source);
    if (!bVar1) break;
    GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::Current
              (&local_1d0,&local_130.source);
    sVar2 = sVar2 + 1;
    IEnumerable<int_&>::~IEnumerable(&local_1d0.super_IEnumerable<int_&>);
    iterator::operator++(&local_130);
  }
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::~GroupByState
            (&local_1b0.source);
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::~GroupByState
            (&local_130.source);
  return sVar2;
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}